

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

bool testing::internal::
     TypeParameterizedTestSuite<FlatBlockEstimatorTest,_testing::internal::Templates<gtest_suite_FlatBlockEstimatorTest_::ExtractBlock,_gtest_suite_FlatBlockEstimatorTest_::FindFlatBlocks>,_testing::internal::Types<BitDepthParams<unsigned_char,_8,_false>,_BitDepthParams<unsigned_short,_8,_true>,_BitDepthParams<unsigned_short,_10,_true>,_BitDepthParams<unsigned_short,_12,_true>_>_>
     ::Register(char *prefix,CodeLocation *code_location,TypedTestSuitePState *state,char *case_name
               ,char *test_names,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *type_names)

{
  bool bVar1;
  byte bVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 in_RCX;
  char *in_R9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000068;
  int in_stack_00000074;
  char *in_stack_00000078;
  char *in_stack_00000080;
  CodeLocation *in_stack_00000088;
  CodeLocation *test_location;
  string test_name;
  undefined7 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffecf;
  TypedTestSuitePState *in_stack_fffffffffffffed0;
  string *in_stack_fffffffffffffef8;
  string *this;
  TypedTestSuitePState *in_stack_ffffffffffffff00;
  FILE *__stream;
  string *in_stack_ffffffffffffff08;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  string local_a0 [36];
  int in_stack_ffffffffffffff84;
  char *in_stack_ffffffffffffff88;
  string local_70 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  TypedTestSuitePState *in_stack_ffffffffffffffc0;
  CodeLocation *in_stack_ffffffffffffffc8;
  
  RegisterTypeParameterizedTestSuiteInstantiation((char *)0x5a7a89);
  GetPrefixUntilComma_abi_cxx11_
            ((char *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
  StripTrailingSpaces(in_stack_ffffffffffffff08);
  std::__cxx11::string::~string(local_70);
  bVar1 = TypedTestSuitePState::TestExists
                    (in_stack_fffffffffffffed0,
                     (string *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
  if (!bVar1) {
    __stream = _stderr;
    uVar3 = std::__cxx11::string::c_str();
    std::__cxx11::string::c_str();
    FormatFileLocation_abi_cxx11_(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84);
    this = local_a0;
    uVar4 = std::__cxx11::string::c_str();
    fprintf(__stream,"Failed to get code location for test %s.%s at %s.",in_RCX,uVar3,uVar4);
    std::__cxx11::string::~string(this);
    fflush(_stderr);
    posix::Abort();
  }
  TypedTestSuitePState::GetCodeLocation(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  TypeParameterizedTest<FlatBlockEstimatorTest,_testing::internal::TemplateSel<gtest_suite_FlatBlockEstimatorTest_::ExtractBlock>,_testing::internal::Types<BitDepthParams<unsigned_char,_8,_false>,_BitDepthParams<unsigned_short,_8,_true>,_BitDepthParams<unsigned_short,_10,_true>,_BitDepthParams<unsigned_short,_12,_true>_>_>
  ::Register((char *)test_location,in_stack_00000088,in_stack_00000080,in_stack_00000078,
             in_stack_00000074,in_stack_00000068);
  CodeLocation::CodeLocation
            ((CodeLocation *)in_stack_fffffffffffffed0,
             (CodeLocation *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
  SkipComma((char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
  bVar2 = TypeParameterizedTestSuite<FlatBlockEstimatorTest,_testing::internal::Templates<gtest_suite_FlatBlockEstimatorTest_::FindFlatBlocks>,_testing::internal::Types<BitDepthParams<unsigned_char,_8,_false>,_BitDepthParams<unsigned_short,_8,_true>,_BitDepthParams<unsigned_short,_10,_true>,_BitDepthParams<unsigned_short,_12,_true>_>_>
          ::Register(in_R9,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                     in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  CodeLocation::~CodeLocation((CodeLocation *)0x5a7cad);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  return (bool)(bVar2 & 1);
}

Assistant:

static bool Register(const char* prefix, CodeLocation code_location,
                       const TypedTestSuitePState* state, const char* case_name,
                       const char* test_names,
                       const std::vector<std::string>& type_names =
                           GenerateNames<DefaultNameGenerator, Types>()) {
    RegisterTypeParameterizedTestSuiteInstantiation(case_name);
    std::string test_name =
        StripTrailingSpaces(GetPrefixUntilComma(test_names));
    if (!state->TestExists(test_name)) {
      fprintf(stderr, "Failed to get code location for test %s.%s at %s.",
              case_name, test_name.c_str(),
              FormatFileLocation(code_location.file.c_str(), code_location.line)
                  .c_str());
      fflush(stderr);
      posix::Abort();
    }
    const CodeLocation& test_location = state->GetCodeLocation(test_name);

    typedef typename Tests::Head Head;

    // First, register the first test in 'Test' for each type in 'Types'.
    TypeParameterizedTest<Fixture, Head, Types>::Register(
        prefix, test_location, case_name, test_names, 0, type_names);

    // Next, recurses (at compile time) with the tail of the test list.
    return TypeParameterizedTestSuite<Fixture, typename Tests::Tail,
                                      Types>::Register(prefix, code_location,
                                                       state, case_name,
                                                       SkipComma(test_names),
                                                       type_names);
  }